

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  SquareMatrix3<double> *m2;
  RectMatrix<double,_3U,_3U> *m;
  StuntDouble *this_00;
  Vector<double,_3U> *v2;
  Vector<double,_3U> *pVVar4;
  reference ppAVar5;
  long *in_RDI;
  SquareMatrix3<double> *m1;
  Vector<double,_3U> *v;
  StuntDouble *this_01;
  uint i;
  Vector3d velRot;
  Vector3d rbVel;
  Mat3x3d mat;
  Mat3x3d I;
  Vector3d ji;
  Mat3x3d skewMat;
  value_type v_00;
  StuntDouble *in_stack_fffffffffffffcd8;
  uint local_1cc;
  RectMatrix<double,_3U,_3U> local_c0;
  Vector<double,_3U> local_68;
  RectMatrix<double,_3U,_3U> local_50;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x330fbc);
  StuntDouble::getJ(in_stack_fffffffffffffcd8);
  (**(code **)(*in_RDI + 0x28))(&local_c0);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,0,0);
  *pdVar3 = 0.0;
  pdVar3 = Vector<double,_3U>::operator[](&local_68,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,0,1);
  *pdVar3 = dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_68,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,0,2);
  *pdVar3 = -dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_68,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,1,0);
  *pdVar3 = -dVar1 / dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,1,1);
  *pdVar3 = 0.0;
  pdVar3 = Vector<double,_3U>::operator[](&local_68,0);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,1,2);
  *pdVar3 = dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_68,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
  m1 = (SquareMatrix3<double> *)(dVar1 / *pdVar3);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,2,0);
  *pdVar3 = (double)m1;
  m2 = (SquareMatrix3<double> *)Vector<double,_3U>::operator[](&local_68,0);
  v = (Vector<double,_3U> *)
      ((ulong)(m2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] ^
      0x8000000000000000);
  m = (RectMatrix<double,_3U,_3U> *)RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
  this_01 = (StuntDouble *)((double)v / m->data_[0][0]);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_50,2,1);
  *pdVar3 = (double)this_01;
  this_00 = (StuntDouble *)RectMatrix<double,_3U,_3U>::operator()(&local_50,2,2);
  this_00->_vptr_StuntDouble = (_func_int **)0x0;
  StuntDouble::getA(this_00);
  OpenMD::operator*(m1,m2);
  SquareMatrix3<double>::transpose(m1);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x33146b);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x331478);
  StuntDouble::getVel(this_00);
  Vector3<double>::Vector3((Vector3<double> *)0x33149c);
  local_1cc = 0;
  while( true ) {
    v2 = (Vector<double,_3U> *)(ulong)local_1cc;
    pVVar4 = (Vector<double,_3U> *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                       ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)(in_RDI + 0x2b));
    if (pVVar4 <= v2) break;
    ppAVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x25),
                         (ulong)local_1cc);
    v_00 = *ppAVar5;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x2b),(ulong)local_1cc);
    OpenMD::operator*(m,v);
    OpenMD::operator+((Vector<double,_3U> *)this_00,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,(Vector<double,_3U> *)v_00);
    StuntDouble::setVel(this_01,(Vector3d *)this_00);
    local_1cc = local_1cc + 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x33163e);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x33164b);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x331658);
  return;
}

Assistant:

void RigidBody::updateAtomVel() {
    Mat3x3d skewMat;

    Vector3d ji = getJ();
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA() * skewMat).transpose();
    Vector3d rbVel = getVel();

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i]);
    }
  }